

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_writer_add_mem_ex_v2
                  (mz_zip_archive *pZip,char *pArchive_name,void *pBuf,size_t buf_size,
                  void *pComment,mz_uint16 comment_size,mz_uint level_and_flags,
                  mz_uint64 uncomp_size,mz_uint32 uncomp_crc32,time_t *last_modified,
                  char *user_extra_data,mz_uint user_extra_data_len,char *user_extra_data_central,
                  mz_uint user_extra_data_central_len)

{
  mz_zip_internal_state *pArray;
  mz_uint8 mVar1;
  mz_bool mVar4;
  mz_uint flags;
  tdefl_status tVar5;
  mz_ulong mVar6;
  long lVar7;
  size_t sVar8;
  ulong uVar9;
  void *pvVar10;
  mz_uint64 *local_408;
  mz_uint64 *local_3f8;
  mz_uint64 *local_3e8;
  mz_uint64 *local_3d0;
  mz_uint64 *local_3c0;
  mz_uint64 *local_3b0;
  bool local_39d;
  uint local_39c;
  undefined1 local_398;
  undefined1 local_397;
  undefined1 local_396;
  undefined1 local_395;
  mz_uint32 local_dir_footer_size;
  mz_uint8 local_dir_footer [24];
  mz_zip_writer_add_state state;
  time_t cur_time;
  mz_uint8 local_358 [6];
  mz_uint16 bit_flags;
  mz_uint8 extra_data [28];
  mz_uint32 extra_size;
  mz_uint8 *pExtra_data;
  mz_zip_internal_state *pState;
  tdefl_compressor *ptStack_320;
  mz_bool store_data_uncompressed;
  tdefl_compressor *pComp;
  mz_uint8 local_dir_header [30];
  size_t archive_name_size;
  mz_uint64 comp_size;
  mz_uint64 cur_archive_file_ofs;
  mz_uint64 local_dir_header_ofs;
  uint local_2d0;
  mz_uint num_alignment_padding_bytes;
  mz_uint ext_attributes;
  mz_uint level;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  mz_uint16 method;
  mz_uint16 comment_size_local;
  void *pComment_local;
  size_t buf_size_local;
  void *pBuf_local;
  char *pArchive_name_local;
  mz_zip_archive *pZip_local;
  undefined8 local_148;
  mz_zip_array *local_140;
  char *local_138;
  long local_130;
  mz_zip_internal_state *local_128;
  char *local_120;
  undefined4 local_114;
  mz_uint8 *local_110;
  undefined4 local_104;
  mz_uint8 *local_100;
  mz_uint32 local_f4;
  mz_uint32 *local_f0;
  undefined4 local_e4;
  undefined1 *local_e0;
  mz_uint64 local_d8;
  mz_uint8 *local_d0;
  undefined4 local_c4;
  mz_uint8 *local_c0;
  undefined4 local_b4;
  mz_uint8 *local_b0;
  size_t local_a8;
  mz_uint8 *local_a0;
  undefined4 local_94;
  mz_uint8 *local_90;
  undefined4 local_84;
  mz_uint8 *local_80;
  undefined4 local_74;
  ulong local_70;
  mz_zip_internal_state *local_68;
  char *local_60;
  int local_58;
  undefined4 local_54;
  ulong local_50;
  mz_zip_array *local_48;
  char *local_40;
  int local_34;
  mz_uint8 mVar2;
  mz_uint8 mVar3;
  
  level._0_2_ = 0;
  ext_attributes._2_2_ = 0;
  ext_attributes._0_2_ = 0;
  local_2d0 = 0;
  cur_archive_file_ofs = pZip->m_archive_size;
  comp_size = pZip->m_archive_size;
  archive_name_size = 0;
  ptStack_320 = (tdefl_compressor *)0x0;
  stack0xfffffffffffffcc8 = (mz_uint8 *)0x0;
  extra_data[0x14] = '\0';
  extra_data[0x15] = '\0';
  extra_data[0x16] = '\0';
  extra_data[0x17] = '\0';
  cur_time._6_2_ = 0;
  if ((int)level_and_flags < 0) {
    level_and_flags = 6;
  }
  if ((uncomp_size != 0) || ((buf_size != 0 && ((level_and_flags & 0x400) == 0)))) {
    cur_time._6_2_ = 8;
  }
  if ((level_and_flags & 0x10000) == 0) {
    cur_time._6_2_ = cur_time._6_2_ | 0x800;
  }
  num_alignment_padding_bytes = level_and_flags & 0xf;
  local_39d = num_alignment_padding_bytes == 0 || (level_and_flags & 0x400) != 0;
  if ((((((pZip == (mz_zip_archive *)0x0) || (pZip->m_pState == (mz_zip_internal_state *)0x0)) ||
        (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) || ((buf_size != 0 && (pBuf == (void *)0x0)))) ||
      ((pArchive_name == (char *)0x0 || ((comment_size != 0 && (pComment == (void *)0x0)))))) ||
     (10 < num_alignment_padding_bytes)) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    }
  }
  else {
    pArray = pZip->m_pState;
    if (pArray->m_zip64 == 0) {
      if (pZip->m_total_files == 0xffff) {
        pArray->m_zip64 = 1;
      }
      if ((0xffffffff < buf_size) || (0xffffffff < uncomp_size)) {
        pArray->m_zip64 = 1;
      }
    }
    else if (pZip->m_total_files == 0xffffffff) {
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
      }
      return 0;
    }
    if (((level_and_flags & 0x400) == 0) && (uncomp_size != 0)) {
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
      }
    }
    else {
      level._2_2_ = comment_size;
      _dos_date = pComment;
      pComment_local = (void *)buf_size;
      buf_size_local = (size_t)pBuf;
      pBuf_local = pArchive_name;
      pArchive_name_local = (char *)pZip;
      mVar4 = mz_zip_writer_validate_archive_name(pArchive_name);
      if (mVar4 == 0) {
        if (pArchive_name_local != (char *)0x0) {
          pArchive_name_local[0x1c] = '\x19';
          pArchive_name_local[0x1d] = '\0';
          pArchive_name_local[0x1e] = '\0';
          pArchive_name_local[0x1f] = '\0';
        }
      }
      else {
        if (last_modified == (time_t *)0x0) {
          time((time_t *)&state.m_comp_size);
          mz_zip_time_t_to_dos_time
                    (state.m_comp_size,(mz_uint16 *)((long)&ext_attributes + 2),
                     (mz_uint16 *)&ext_attributes);
        }
        else {
          mz_zip_time_t_to_dos_time
                    (*last_modified,(mz_uint16 *)((long)&ext_attributes + 2),
                     (mz_uint16 *)&ext_attributes);
        }
        if ((level_and_flags & 0x400) == 0) {
          mVar6 = mz_crc32(0,(mz_uint8 *)buf_size_local,(size_t)pComment_local);
          uncomp_crc32 = (mz_uint32)mVar6;
          uncomp_size = (mz_uint64)pComment_local;
          if (pComment_local < (void *)0x4) {
            num_alignment_padding_bytes = 0;
            local_39d = true;
          }
        }
        register0x00000000 = strlen((char *)pBuf_local);
        if (register0x00000000 < 0x10000) {
          local_dir_header_ofs._4_4_ =
               mz_zip_writer_compute_padding_needed_for_file_alignment
                         ((mz_zip_archive *)pArchive_name_local);
          if ((pArray->m_central_dir).m_size + stack0xfffffffffffffd08 + 0x4a + (ulong)level._2_2_ <
              0xffffffff) {
            if ((pArray->m_zip64 == 0) &&
               (0xffffffff <
                *(long *)pArchive_name_local + (ulong)local_dir_header_ofs._4_4_ +
                stack0xfffffffffffffd08 * 2 + (ulong)level._2_2_ + (ulong)user_extra_data_len +
                (pArray->m_central_dir).m_size + (ulong)user_extra_data_central_len + 0x72)) {
              pArray->m_zip64 = 1;
            }
            if (((stack0xfffffffffffffd08 == 0) ||
                (*(char *)((long)pBuf_local + (stack0xfffffffffffffd08 - 1)) != '/')) ||
               ((local_2d0 = local_2d0 | 0x10, pComment_local == (void *)0x0 && (uncomp_size == 0)))
               ) {
              local_130 = 0;
              if (pArray->m_zip64 != 0) {
                local_130 = 0x1c;
              }
              local_130 = stack0xfffffffffffffd08 + 0x2e + (ulong)level._2_2_ + local_130;
              local_120 = pArchive_name_local;
              local_70 = (pArray->m_central_dir).m_size + local_130;
              local_60 = pArchive_name_local;
              local_74 = 1;
              local_128 = pArray;
              local_68 = pArray;
              if (((pArray->m_central_dir).m_capacity < local_70) &&
                 (mVar4 = mz_zip_array_ensure_capacity
                                    ((mz_zip_archive *)pArchive_name_local,&pArray->m_central_dir,
                                     local_70,1), mVar4 == 0)) {
                local_58 = 0;
              }
              else {
                local_58 = 1;
              }
              if (local_58 != 0) {
                local_140 = &pArray->m_central_dir_offsets;
                local_138 = pArchive_name_local;
                local_148 = 1;
                local_50 = (pArray->m_central_dir_offsets).m_size + 1;
                local_40 = pArchive_name_local;
                local_54 = 1;
                local_48 = local_140;
                if (((pArray->m_central_dir_offsets).m_capacity < local_50) &&
                   (mVar4 = mz_zip_array_ensure_capacity
                                      ((mz_zip_archive *)pArchive_name_local,local_140,local_50,1),
                   mVar4 == 0)) {
                  local_34 = 0;
                }
                else {
                  local_34 = 1;
                }
                if (local_34 != 0) {
                  if (((!local_39d) && (pComment_local != (void *)0x0)) &&
                     (ptStack_320 = (tdefl_compressor *)
                                    (**(code **)(pArchive_name_local + 0x28))
                                              (*(undefined8 *)(pArchive_name_local + 0x40),1,0x4df78
                                              ), ptStack_320 == (tdefl_compressor *)0x0)) {
                    if (pArchive_name_local != (char *)0x0) {
                      pArchive_name_local[0x1c] = '\x10';
                      pArchive_name_local[0x1d] = '\0';
                      pArchive_name_local[0x1e] = '\0';
                      pArchive_name_local[0x1f] = '\0';
                    }
                    return 0;
                  }
                  mVar4 = mz_zip_writer_write_zeros
                                    ((mz_zip_archive *)pArchive_name_local,comp_size,
                                     local_dir_header_ofs._4_4_);
                  if (mVar4 == 0) {
                    (**(code **)(pArchive_name_local + 0x30))
                              (*(undefined8 *)(pArchive_name_local + 0x40),ptStack_320);
                    return 0;
                  }
                  cur_archive_file_ofs = local_dir_header_ofs._4_4_ + cur_archive_file_ofs;
                  if ((*(long *)(pArchive_name_local + 0x20) != 0) &&
                     ((cur_archive_file_ofs & *(long *)(pArchive_name_local + 0x20) - 1U) != 0)) {
                    __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/src/miniz.h"
                                  ,0x217f,
                                  "mz_bool mz_zip_writer_add_mem_ex_v2(mz_zip_archive *, const char *, const void *, size_t, const void *, mz_uint16, mz_uint, mz_uint64, mz_uint32, time_t *, const char *, mz_uint, const char *, mz_uint)"
                                 );
                  }
                  comp_size = local_dir_header_ofs._4_4_ + comp_size;
                  memset(&pComp,0,0x1e);
                  if ((!local_39d) || ((level_and_flags & 0x400) != 0)) {
                    level._0_2_ = 8;
                  }
                  if (pArray->m_zip64 == 0) {
                    if ((0xffffffff < archive_name_size) || (0xffffffff < comp_size)) {
                      if (pArchive_name_local != (char *)0x0) {
                        pArchive_name_local[0x1c] = '\x1d';
                        pArchive_name_local[0x1d] = '\0';
                        pArchive_name_local[0x1e] = '\0';
                        pArchive_name_local[0x1f] = '\0';
                      }
                      return 0;
                    }
                    mVar4 = mz_zip_writer_create_local_dir_header
                                      ((mz_zip_archive *)pArchive_name_local,(mz_uint8 *)&pComp,
                                       (mz_uint16)stack0xfffffffffffffd08,
                                       (mz_uint16)user_extra_data_len,0,0,0,(mz_uint16)level,
                                       cur_time._6_2_,ext_attributes._2_2_,(mz_uint16)ext_attributes
                                      );
                    if (mVar4 == 0) {
                      if (pArchive_name_local != (char *)0x0) {
                        pArchive_name_local[0x1c] = '\x1b';
                        pArchive_name_local[0x1d] = '\0';
                        pArchive_name_local[0x1e] = '\0';
                        pArchive_name_local[0x1f] = '\0';
                      }
                      return 0;
                    }
                    lVar7 = (**(code **)(pArchive_name_local + 0x50))
                                      (*(undefined8 *)(pArchive_name_local + 0x60),
                                       cur_archive_file_ofs,&pComp,0x1e);
                    if (lVar7 != 0x1e) {
                      if (pArchive_name_local != (char *)0x0) {
                        pArchive_name_local[0x1c] = '\x13';
                        pArchive_name_local[0x1d] = '\0';
                        pArchive_name_local[0x1e] = '\0';
                        pArchive_name_local[0x1f] = '\0';
                      }
                      return 0;
                    }
                    comp_size = comp_size + 0x1e;
                    sVar8 = (**(code **)(pArchive_name_local + 0x50))
                                      (*(undefined8 *)(pArchive_name_local + 0x60),comp_size,
                                       pBuf_local,stack0xfffffffffffffd08);
                    if (sVar8 != stack0xfffffffffffffd08) {
                      (**(code **)(pArchive_name_local + 0x30))
                                (*(undefined8 *)(pArchive_name_local + 0x40),ptStack_320);
                      if (pArchive_name_local != (char *)0x0) {
                        pArchive_name_local[0x1c] = '\x13';
                        pArchive_name_local[0x1d] = '\0';
                        pArchive_name_local[0x1e] = '\0';
                        pArchive_name_local[0x1f] = '\0';
                      }
                      return 0;
                    }
                    comp_size = stack0xfffffffffffffd08 + comp_size;
                  }
                  else {
                    if ((0xfffffffe < uncomp_size) || (0xfffffffe < cur_archive_file_ofs)) {
                      unique0x00004880 = local_358;
                      if (uncomp_size < 0xffffffff) {
                        local_3b0 = (mz_uint64 *)0x0;
                        local_3c0 = (mz_uint64 *)0x0;
                      }
                      else {
                        local_3b0 = &uncomp_size;
                        local_3c0 = &archive_name_size;
                      }
                      if (cur_archive_file_ofs < 0xffffffff) {
                        local_3d0 = (mz_uint64 *)0x0;
                      }
                      else {
                        local_3d0 = &cur_archive_file_ofs;
                      }
                      extra_data._20_4_ =
                           mz_zip_writer_create_zip64_extra_data
                                     (local_358,local_3b0,local_3c0,local_3d0);
                    }
                    mVar4 = mz_zip_writer_create_local_dir_header
                                      ((mz_zip_archive *)pArchive_name_local,(mz_uint8 *)&pComp,
                                       (mz_uint16)stack0xfffffffffffffd08,
                                       (short)extra_data._20_4_ + (short)user_extra_data_len,0,0,0,
                                       (mz_uint16)level,cur_time._6_2_,ext_attributes._2_2_,
                                       (mz_uint16)ext_attributes);
                    if (mVar4 == 0) {
                      if (pArchive_name_local != (char *)0x0) {
                        pArchive_name_local[0x1c] = '\x1b';
                        pArchive_name_local[0x1d] = '\0';
                        pArchive_name_local[0x1e] = '\0';
                        pArchive_name_local[0x1f] = '\0';
                      }
                      return 0;
                    }
                    lVar7 = (**(code **)(pArchive_name_local + 0x50))
                                      (*(undefined8 *)(pArchive_name_local + 0x60),
                                       cur_archive_file_ofs,&pComp,0x1e);
                    if (lVar7 != 0x1e) {
                      if (pArchive_name_local != (char *)0x0) {
                        pArchive_name_local[0x1c] = '\x13';
                        pArchive_name_local[0x1d] = '\0';
                        pArchive_name_local[0x1e] = '\0';
                        pArchive_name_local[0x1f] = '\0';
                      }
                      return 0;
                    }
                    comp_size = comp_size + 0x1e;
                    sVar8 = (**(code **)(pArchive_name_local + 0x50))
                                      (*(undefined8 *)(pArchive_name_local + 0x60),comp_size,
                                       pBuf_local,stack0xfffffffffffffd08);
                    if (sVar8 != stack0xfffffffffffffd08) {
                      (**(code **)(pArchive_name_local + 0x30))
                                (*(undefined8 *)(pArchive_name_local + 0x40),ptStack_320);
                      if (pArchive_name_local != (char *)0x0) {
                        pArchive_name_local[0x1c] = '\x13';
                        pArchive_name_local[0x1d] = '\0';
                        pArchive_name_local[0x1e] = '\0';
                        pArchive_name_local[0x1f] = '\0';
                      }
                      return 0;
                    }
                    comp_size = stack0xfffffffffffffd08 + comp_size;
                    if (stack0xfffffffffffffcc8 != (mz_uint8 *)0x0) {
                      uVar9 = (**(code **)(pArchive_name_local + 0x50))
                                        (*(undefined8 *)(pArchive_name_local + 0x60),comp_size,
                                         local_358,extra_data._20_4_);
                      if (uVar9 != (uint)extra_data._20_4_) {
                        if (pArchive_name_local != (char *)0x0) {
                          pArchive_name_local[0x1c] = '\x13';
                          pArchive_name_local[0x1d] = '\0';
                          pArchive_name_local[0x1e] = '\0';
                          pArchive_name_local[0x1f] = '\0';
                        }
                        return 0;
                      }
                      comp_size = (uint)extra_data._20_4_ + comp_size;
                    }
                  }
                  if (user_extra_data_len != 0) {
                    uVar9 = (**(code **)(pArchive_name_local + 0x50))
                                      (*(undefined8 *)(pArchive_name_local + 0x60),comp_size,
                                       user_extra_data,user_extra_data_len);
                    if (uVar9 != user_extra_data_len) {
                      if (pArchive_name_local != (char *)0x0) {
                        pArchive_name_local[0x1c] = '\x13';
                        pArchive_name_local[0x1d] = '\0';
                        pArchive_name_local[0x1e] = '\0';
                        pArchive_name_local[0x1f] = '\0';
                      }
                      return 0;
                    }
                    comp_size = user_extra_data_len + comp_size;
                  }
                  if (local_39d) {
                    pvVar10 = (void *)(**(code **)(pArchive_name_local + 0x50))
                                                (*(undefined8 *)(pArchive_name_local + 0x60),
                                                 comp_size,buf_size_local,pComment_local);
                    if (pvVar10 != pComment_local) {
                      (**(code **)(pArchive_name_local + 0x30))
                                (*(undefined8 *)(pArchive_name_local + 0x40),ptStack_320);
                      if (pArchive_name_local != (char *)0x0) {
                        pArchive_name_local[0x1c] = '\x13';
                        pArchive_name_local[0x1d] = '\0';
                        pArchive_name_local[0x1e] = '\0';
                        pArchive_name_local[0x1f] = '\0';
                      }
                      return 0;
                    }
                    comp_size = (long)pComment_local + comp_size;
                    archive_name_size = (size_t)pComment_local;
                  }
                  else if (pComment_local != (void *)0x0) {
                    local_dir_footer._16_8_ = pArchive_name_local;
                    state.m_pZip = (mz_zip_archive *)comp_size;
                    state.m_cur_archive_file_ofs = 0;
                    flags = tdefl_create_comp_flags_from_zip_params
                                      (num_alignment_padding_bytes,-0xf,0);
                    tVar5 = tdefl_init(ptStack_320,mz_zip_writer_add_put_buf_callback,
                                       local_dir_footer + 0x10,flags);
                    if ((tVar5 != TDEFL_STATUS_OKAY) ||
                       (tVar5 = tdefl_compress_buffer
                                          (ptStack_320,(void *)buf_size_local,(size_t)pComment_local
                                           ,TDEFL_FINISH), tVar5 != TDEFL_STATUS_DONE)) {
                      (**(code **)(pArchive_name_local + 0x30))
                                (*(undefined8 *)(pArchive_name_local + 0x40),ptStack_320);
                      if (pArchive_name_local != (char *)0x0) {
                        pArchive_name_local[0x1c] = '\f';
                        pArchive_name_local[0x1d] = '\0';
                        pArchive_name_local[0x1e] = '\0';
                        pArchive_name_local[0x1f] = '\0';
                      }
                      return 0;
                    }
                    archive_name_size = state.m_cur_archive_file_ofs;
                    comp_size = (mz_uint64)state.m_pZip;
                  }
                  (**(code **)(pArchive_name_local + 0x30))
                            (*(undefined8 *)(pArchive_name_local + 0x40),ptStack_320);
                  if (uncomp_size != 0) {
                    local_39c = 0x10;
                    if ((cur_time._6_2_ & 8) == 0) {
                      __assert_fail("bit_flags & MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR",
                                    "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/src/miniz.h"
                                    ,0x21f5,
                                    "mz_bool mz_zip_writer_add_mem_ex_v2(mz_zip_archive *, const char *, const void *, size_t, const void *, mz_uint16, mz_uint, mz_uint64, mz_uint32, time_t *, const char *, mz_uint, const char *, mz_uint)"
                                   );
                    }
                    local_e0 = &local_398;
                    local_e4 = 0x8074b50;
                    local_398 = 0x50;
                    local_397 = 0x4b;
                    local_396 = 7;
                    local_395 = 8;
                    local_f0 = &local_dir_footer_size;
                    local_f4 = uncomp_crc32;
                    local_dir_footer_size._0_1_ = (undefined1)uncomp_crc32;
                    local_dir_footer_size._1_1_ = (undefined1)(uncomp_crc32 >> 8);
                    local_dir_footer_size._2_1_ = (undefined1)(uncomp_crc32 >> 0x10);
                    local_dir_footer_size._3_1_ = (undefined1)(uncomp_crc32 >> 0x18);
                    local_dir_footer[0] = (mz_uint8)archive_name_size;
                    local_dir_footer[1] = (mz_uint8)(archive_name_size >> 8);
                    local_dir_footer[2] = (mz_uint8)(archive_name_size >> 0x10);
                    local_dir_footer[3] = (mz_uint8)(archive_name_size >> 0x18);
                    mVar1 = (mz_uint8)(uncomp_size >> 8);
                    mVar2 = (mz_uint8)(uncomp_size >> 0x10);
                    mVar3 = (mz_uint8)(uncomp_size >> 0x18);
                    if (stack0xfffffffffffffcc8 == (mz_uint8 *)0x0) {
                      if (0xffffffff < archive_name_size) {
                        if (pArchive_name_local != (char *)0x0) {
                          pArchive_name_local[0x1c] = '\x1d';
                          pArchive_name_local[0x1d] = '\0';
                          pArchive_name_local[0x1e] = '\0';
                          pArchive_name_local[0x1f] = '\0';
                        }
                        return 0;
                      }
                      local_100 = local_dir_footer;
                      local_110 = local_dir_footer + 4;
                      local_114 = (int)uncomp_size;
                      local_104 = (int)archive_name_size;
                      local_dir_footer[4] = (mz_uint8)uncomp_size;
                      local_dir_footer[5] = mVar1;
                      local_dir_footer[6] = mVar2;
                      local_dir_footer[7] = mVar3;
                    }
                    else {
                      local_a0 = local_dir_footer;
                      local_a8 = archive_name_size;
                      local_90 = local_dir_footer + 4;
                      local_94 = (undefined4)(archive_name_size >> 0x20);
                      local_dir_footer[4] = (mz_uint8)(archive_name_size >> 0x20);
                      local_dir_footer[5] = (mz_uint8)(archive_name_size >> 0x28);
                      local_dir_footer[6] = (mz_uint8)(archive_name_size >> 0x30);
                      local_dir_footer[7] = (mz_uint8)(archive_name_size >> 0x38);
                      local_d0 = local_dir_footer + 8;
                      local_d8 = uncomp_size;
                      local_c0 = local_dir_footer + 0xc;
                      local_c4 = (undefined4)(uncomp_size >> 0x20);
                      local_dir_footer[0xc] = (mz_uint8)(uncomp_size >> 0x20);
                      local_dir_footer[0xd] = (mz_uint8)(uncomp_size >> 0x28);
                      local_dir_footer[0xe] = (mz_uint8)(uncomp_size >> 0x30);
                      local_dir_footer[0xf] = (mz_uint8)(uncomp_size >> 0x38);
                      local_39c = 0x18;
                      local_b4 = (int)uncomp_size;
                      local_b0 = local_d0;
                      local_84 = (int)archive_name_size;
                      local_80 = local_a0;
                      local_dir_footer[8] = (mz_uint8)uncomp_size;
                      local_dir_footer[9] = mVar1;
                      local_dir_footer[10] = mVar2;
                      local_dir_footer[0xb] = mVar3;
                    }
                    uVar9 = (**(code **)(pArchive_name_local + 0x50))
                                      (*(undefined8 *)(pArchive_name_local + 0x60),comp_size,
                                       &local_398,local_39c);
                    if (uVar9 != local_39c) {
                      return 0;
                    }
                    comp_size = local_39c + comp_size;
                  }
                  if (stack0xfffffffffffffcc8 != (mz_uint8 *)0x0) {
                    if (uncomp_size < 0xffffffff) {
                      local_3e8 = (mz_uint64 *)0x0;
                      local_3f8 = (mz_uint64 *)0x0;
                    }
                    else {
                      local_3e8 = &uncomp_size;
                      local_3f8 = &archive_name_size;
                    }
                    if (cur_archive_file_ofs < 0xffffffff) {
                      local_408 = (mz_uint64 *)0x0;
                    }
                    else {
                      local_408 = &cur_archive_file_ofs;
                    }
                    extra_data._20_4_ =
                         mz_zip_writer_create_zip64_extra_data
                                   (local_358,local_3e8,local_3f8,local_408);
                  }
                  mVar4 = mz_zip_writer_add_to_central_dir
                                    ((mz_zip_archive *)pArchive_name_local,(char *)pBuf_local,
                                     (mz_uint16)stack0xfffffffffffffd08,stack0xfffffffffffffcc8,
                                     (mz_uint16)extra_data._20_4_,_dos_date,level._2_2_,uncomp_size,
                                     archive_name_size,uncomp_crc32,(mz_uint16)level,cur_time._6_2_,
                                     ext_attributes._2_2_,(mz_uint16)ext_attributes,
                                     cur_archive_file_ofs,local_2d0,user_extra_data_central,
                                     user_extra_data_central_len);
                  if (mVar4 != 0) {
                    *(int *)(pArchive_name_local + 0x10) = *(int *)(pArchive_name_local + 0x10) + 1;
                    *(mz_uint64 *)pArchive_name_local = comp_size;
                    return 1;
                  }
                  return 0;
                }
              }
              if (pArchive_name_local != (char *)0x0) {
                pArchive_name_local[0x1c] = '\x10';
                pArchive_name_local[0x1d] = '\0';
                pArchive_name_local[0x1e] = '\0';
                pArchive_name_local[0x1f] = '\0';
              }
            }
            else if (pArchive_name_local != (char *)0x0) {
              pArchive_name_local[0x1c] = '\x18';
              pArchive_name_local[0x1d] = '\0';
              pArchive_name_local[0x1e] = '\0';
              pArchive_name_local[0x1f] = '\0';
            }
          }
          else if (pArchive_name_local != (char *)0x0) {
            pArchive_name_local[0x1c] = '\x0f';
            pArchive_name_local[0x1d] = '\0';
            pArchive_name_local[0x1e] = '\0';
            pArchive_name_local[0x1f] = '\0';
          }
        }
        else if (pArchive_name_local != (char *)0x0) {
          pArchive_name_local[0x1c] = '\x19';
          pArchive_name_local[0x1d] = '\0';
          pArchive_name_local[0x1e] = '\0';
          pArchive_name_local[0x1f] = '\0';
        }
      }
    }
  }
  return 0;
}

Assistant:

mz_bool mz_zip_writer_add_mem_ex_v2(
    mz_zip_archive *pZip, const char *pArchive_name, const void *pBuf,
    size_t buf_size, const void *pComment, mz_uint16 comment_size,
    mz_uint level_and_flags, mz_uint64 uncomp_size, mz_uint32 uncomp_crc32,
    MZ_TIME_T *last_modified, const char *user_extra_data,
    mz_uint user_extra_data_len, const char *user_extra_data_central,
    mz_uint user_extra_data_central_len) {
  mz_uint16 method = 0, dos_time = 0, dos_date = 0;
  mz_uint level, ext_attributes = 0, num_alignment_padding_bytes;
  mz_uint64 local_dir_header_ofs = pZip->m_archive_size,
            cur_archive_file_ofs = pZip->m_archive_size, comp_size = 0;
  size_t archive_name_size;
  mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
  tdefl_compressor *pComp = NULL;
  mz_bool store_data_uncompressed;
  mz_zip_internal_state *pState;
  mz_uint8 *pExtra_data = NULL;
  mz_uint32 extra_size = 0;
  mz_uint8 extra_data[MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE];
  mz_uint16 bit_flags = 0;

  if ((int)level_and_flags < 0)
    level_and_flags = MZ_DEFAULT_LEVEL;

  if (uncomp_size ||
      (buf_size && !(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)))
    bit_flags |= MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR;

  if (!(level_and_flags & MZ_ZIP_FLAG_ASCII_FILENAME))
    bit_flags |= MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_UTF8;

  level = level_and_flags & 0xF;
  store_data_uncompressed =
      ((!level) || (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA));

  if ((!pZip) || (!pZip->m_pState) ||
      (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || ((buf_size) && (!pBuf)) ||
      (!pArchive_name) || ((comment_size) && (!pComment)) ||
      (level > MZ_UBER_COMPRESSION))
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

  pState = pZip->m_pState;

  if (pState->m_zip64) {
    if (pZip->m_total_files == MZ_UINT32_MAX)
      return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
  } else {
    if (pZip->m_total_files == MZ_UINT16_MAX) {
      pState->m_zip64 = MZ_TRUE;
      /*return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES); */
    }
    if (((mz_uint64)buf_size > 0xFFFFFFFF) || (uncomp_size > 0xFFFFFFFF)) {
      pState->m_zip64 = MZ_TRUE;
      /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
    }
  }

  if ((!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (uncomp_size))
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

  if (!mz_zip_writer_validate_archive_name(pArchive_name))
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

#ifndef MINIZ_NO_TIME
  if (last_modified != NULL) {
    mz_zip_time_t_to_dos_time(*last_modified, &dos_time, &dos_date);
  } else {
    MZ_TIME_T cur_time;
    time(&cur_time);
    mz_zip_time_t_to_dos_time(cur_time, &dos_time, &dos_date);
  }
#else
  (void)last_modified;
#endif /* #ifndef MINIZ_NO_TIME */

  if (!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) {
    uncomp_crc32 =
        (mz_uint32)mz_crc32(MZ_CRC32_INIT, (const mz_uint8 *)pBuf, buf_size);
    uncomp_size = buf_size;
    if (uncomp_size <= 3) {
      level = 0;
      store_data_uncompressed = MZ_TRUE;
    }
  }

  archive_name_size = strlen(pArchive_name);
  if (archive_name_size > MZ_UINT16_MAX)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

  num_alignment_padding_bytes =
      mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

  /* miniz doesn't support central dirs >= MZ_UINT32_MAX bytes yet */
  if (((mz_uint64)pState->m_central_dir.m_size +
       MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size +
       MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE + comment_size) >= MZ_UINT32_MAX)
    return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

  if (!pState->m_zip64) {
    /* Bail early if the archive would obviously become too large */
    if ((pZip->m_archive_size + num_alignment_padding_bytes +
         MZ_ZIP_LOCAL_DIR_HEADER_SIZE + archive_name_size +
         MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + comment_size +
         user_extra_data_len + pState->m_central_dir.m_size +
         MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + user_extra_data_central_len +
         MZ_ZIP_DATA_DESCRIPTER_SIZE32) > 0xFFFFFFFF) {
      pState->m_zip64 = MZ_TRUE;
      /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
    }
  }

  if ((archive_name_size) && (pArchive_name[archive_name_size - 1] == '/')) {
    /* Set DOS Subdirectory attribute bit. */
    ext_attributes |= MZ_ZIP_DOS_DIR_ATTRIBUTE_BITFLAG;

    /* Subdirectories cannot contain data. */
    if ((buf_size) || (uncomp_size))
      return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);
  }

  /* Try to do any allocations before writing to the archive, so if an
   * allocation fails the file remains unmodified. (A good idea if we're doing
   * an in-place modification.) */
  if ((!mz_zip_array_ensure_room(
          pZip, &pState->m_central_dir,
          MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + comment_size +
              (pState->m_zip64 ? MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE : 0))) ||
      (!mz_zip_array_ensure_room(pZip, &pState->m_central_dir_offsets, 1)))
    return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

  if ((!store_data_uncompressed) && (buf_size)) {
    if (NULL == (pComp = (tdefl_compressor *)pZip->m_pAlloc(
                     pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor))))
      return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
  }

  if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs,
                                 num_alignment_padding_bytes)) {
    pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
    return MZ_FALSE;
  }

  local_dir_header_ofs += num_alignment_padding_bytes;
  if (pZip->m_file_offset_alignment) {
    MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) ==
              0);
  }
  cur_archive_file_ofs += num_alignment_padding_bytes;

  MZ_CLEAR_ARR(local_dir_header);

  if (!store_data_uncompressed ||
      (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) {
    method = MZ_DEFLATED;
  }

  if (pState->m_zip64) {
    if (uncomp_size >= MZ_UINT32_MAX || local_dir_header_ofs >= MZ_UINT32_MAX) {
      pExtra_data = extra_data;
      extra_size = mz_zip_writer_create_zip64_extra_data(
          extra_data, (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
          (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL,
          (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs
                                                  : NULL);
    }

    if (!mz_zip_writer_create_local_dir_header(
            pZip, local_dir_header, (mz_uint16)archive_name_size,
            (mz_uint16)(extra_size + user_extra_data_len), 0, 0, 0, method,
            bit_flags, dos_time, dos_date))
      return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

    if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs,
                       local_dir_header,
                       sizeof(local_dir_header)) != sizeof(local_dir_header))
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_archive_file_ofs += sizeof(local_dir_header);

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name,
                       archive_name_size) != archive_name_size) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
    }
    cur_archive_file_ofs += archive_name_size;

    if (pExtra_data != NULL) {
      if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, extra_data,
                         extra_size) != extra_size)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

      cur_archive_file_ofs += extra_size;
    }
  } else {
    if ((comp_size > MZ_UINT32_MAX) || (cur_archive_file_ofs > MZ_UINT32_MAX))
      return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
    if (!mz_zip_writer_create_local_dir_header(
            pZip, local_dir_header, (mz_uint16)archive_name_size,
            (mz_uint16)user_extra_data_len, 0, 0, 0, method, bit_flags,
            dos_time, dos_date))
      return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

    if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs,
                       local_dir_header,
                       sizeof(local_dir_header)) != sizeof(local_dir_header))
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_archive_file_ofs += sizeof(local_dir_header);

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name,
                       archive_name_size) != archive_name_size) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
    }
    cur_archive_file_ofs += archive_name_size;
  }

  if (user_extra_data_len > 0) {
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs,
                       user_extra_data,
                       user_extra_data_len) != user_extra_data_len)
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_archive_file_ofs += user_extra_data_len;
  }

  if (store_data_uncompressed) {
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pBuf,
                       buf_size) != buf_size) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
    }

    cur_archive_file_ofs += buf_size;
    comp_size = buf_size;
  } else if (buf_size) {
    mz_zip_writer_add_state state;

    state.m_pZip = pZip;
    state.m_cur_archive_file_ofs = cur_archive_file_ofs;
    state.m_comp_size = 0;

    if ((tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state,
                    tdefl_create_comp_flags_from_zip_params(
                        level, -15, MZ_DEFAULT_STRATEGY)) !=
         TDEFL_STATUS_OKAY) ||
        (tdefl_compress_buffer(pComp, pBuf, buf_size, TDEFL_FINISH) !=
         TDEFL_STATUS_DONE)) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
      return mz_zip_set_error(pZip, MZ_ZIP_COMPRESSION_FAILED);
    }

    comp_size = state.m_comp_size;
    cur_archive_file_ofs = state.m_cur_archive_file_ofs;
  }

  pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
  pComp = NULL;

  if (uncomp_size) {
    mz_uint8 local_dir_footer[MZ_ZIP_DATA_DESCRIPTER_SIZE64];
    mz_uint32 local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE32;

    MZ_ASSERT(bit_flags & MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR);

    MZ_WRITE_LE32(local_dir_footer + 0, MZ_ZIP_DATA_DESCRIPTOR_ID);
    MZ_WRITE_LE32(local_dir_footer + 4, uncomp_crc32);
    if (pExtra_data == NULL) {
      if (comp_size > MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

      MZ_WRITE_LE32(local_dir_footer + 8, comp_size);
      MZ_WRITE_LE32(local_dir_footer + 12, uncomp_size);
    } else {
      MZ_WRITE_LE64(local_dir_footer + 8, comp_size);
      MZ_WRITE_LE64(local_dir_footer + 16, uncomp_size);
      local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE64;
    }

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs,
                       local_dir_footer,
                       local_dir_footer_size) != local_dir_footer_size)
      return MZ_FALSE;

    cur_archive_file_ofs += local_dir_footer_size;
  }

  if (pExtra_data != NULL) {
    extra_size = mz_zip_writer_create_zip64_extra_data(
        extra_data, (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
        (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL,
        (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs : NULL);
  }

  if (!mz_zip_writer_add_to_central_dir(
          pZip, pArchive_name, (mz_uint16)archive_name_size, pExtra_data,
          (mz_uint16)extra_size, pComment, comment_size, uncomp_size, comp_size,
          uncomp_crc32, method, bit_flags, dos_time, dos_date,
          local_dir_header_ofs, ext_attributes, user_extra_data_central,
          user_extra_data_central_len))
    return MZ_FALSE;

  pZip->m_total_files++;
  pZip->m_archive_size = cur_archive_file_ofs;

  return MZ_TRUE;
}